

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

double helics::vectorNorm(vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vec)

{
  const_iterator cVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  double dVar4;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffffd8;
  
  cVar1 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                    (in_stack_ffffffffffffffd8);
  cVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                    (in_stack_ffffffffffffffd8);
  cVar3 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                    (in_stack_ffffffffffffffd8);
  dVar4 = std::
          inner_product<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,double,std::plus<void>,helics::vectorNorm(std::vector<std::complex<double>,std::allocator<std::complex<double>>>const&)::__0>
                    (cVar1._M_current,cVar2._M_current,cVar3._M_current);
  dVar4 = sqrt(dVar4);
  return dVar4;
}

Assistant:

double vectorNorm(const std::vector<std::complex<double>>& vec)
{
    return std::sqrt(std::inner_product(vec.begin(),
                                        vec.end(),
                                        vec.begin(),
                                        0.0,
                                        std::plus<>(),
                                        [](const auto& avec, const auto& bvec) {
                                            return (avec * std::conj(bvec)).real();
                                        }));
}